

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

void nn_ctx_leave(nn_ctx *self)

{
  int iVar1;
  nn_queue_item *pnVar2;
  nn_ctx *self_00;
  long in_RDI;
  nn_queue eventsto;
  nn_fsm_event *event;
  nn_queue_item *item;
  nn_fsm_event *local_38;
  nn_fsm_event *self_01;
  nn_queue local_28;
  nn_fsm_event *local_18;
  
  while( true ) {
    pnVar2 = nn_queue_pop((nn_queue *)(in_RDI + 0x30));
    if (pnVar2 == (nn_queue_item *)0x0) {
      self_01 = (nn_fsm_event *)0x0;
    }
    else {
      self_01 = (nn_fsm_event *)(pnVar2 + -4);
    }
    local_18 = self_01;
    if (self_01 == (nn_fsm_event *)0x0) break;
    nn_fsm_event_process(self_01);
  }
  if (*(long *)(in_RDI + 0x50) != 0) {
    (**(code **)(in_RDI + 0x50))(in_RDI);
  }
  iVar1 = nn_queue_empty((nn_queue *)(in_RDI + 0x40));
  if (iVar1 == 0) {
    local_28.head = *(nn_queue_item **)(in_RDI + 0x40);
    local_28.tail = *(nn_queue_item **)(in_RDI + 0x48);
    nn_queue_init((nn_queue *)(in_RDI + 0x40));
    nn_mutex_unlock((nn_mutex_t *)self_01);
    while( true ) {
      self_00 = (nn_ctx *)nn_queue_pop(&local_28);
      if (self_00 == (nn_ctx *)0x0) {
        local_38 = (nn_fsm_event *)0x0;
      }
      else {
        local_38 = (nn_fsm_event *)&self_00[-1].events.tail;
      }
      local_18 = local_38;
      if (local_38 == (nn_fsm_event *)0x0) break;
      nn_ctx_enter((nn_ctx *)0x2efafa);
      nn_fsm_event_process(self_01);
      nn_ctx_leave(self_00);
    }
    nn_queue_term(&local_28);
  }
  else {
    nn_mutex_unlock((nn_mutex_t *)self_01);
  }
  return;
}

Assistant:

void nn_ctx_leave (struct nn_ctx *self)
{
    struct nn_queue_item *item;
    struct nn_fsm_event *event;
    struct nn_queue eventsto;

    /*  Process any queued events before leaving the context. */
    while (1) {
        item = nn_queue_pop (&self->events);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_fsm_event_process (event);
    }

    /*  Notify the owner that we are leaving the context. */
    if (nn_fast (self->onleave != NULL))
        self->onleave (self);

    /*  Shortcut in the case there are no external events. */
    if (nn_queue_empty (&self->eventsto)) {
        nn_mutex_unlock (&self->sync);
        return;
    }

    /*  Make a copy of the queue of the external events so that it does not
        get corrupted once we unlock the context. */
    eventsto = self->eventsto;
    nn_queue_init (&self->eventsto);

    nn_mutex_unlock (&self->sync);

    /*  Process any queued external events. Before processing each event
        lock the context it belongs to. */
    while (1) {
        item = nn_queue_pop (&eventsto);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_ctx_enter (event->fsm->ctx);
        nn_fsm_event_process (event);
        nn_ctx_leave (event->fsm->ctx);
    }

    nn_queue_term (&eventsto);
}